

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedJoint.cpp
# Opt level: O0

Transform * __thiscall
iDynTree::FixedJoint::getRestTransform(FixedJoint *this,LinkIndex child,LinkIndex parent)

{
  long in_RDX;
  long in_RSI;
  Transform *in_RDI;
  
  if (in_RDX == *(long *)(in_RSI + 0x20)) {
    iDynTree::Transform::Transform(in_RDI,(Transform *)(in_RSI + 0x30));
  }
  else {
    iDynTree::Transform::Transform(in_RDI,(Transform *)(in_RSI + 0x90));
  }
  return in_RDI;
}

Assistant:

Transform FixedJoint::getRestTransform(const LinkIndex child, const LinkIndex parent) const
{
    if( child == this->link1 )
    {
        return this->link1_X_link2;
    }
    else
    {
        assert(child == this->link2);
        assert(parent == this->link1);
        return this->link2_X_link1;
    }
}